

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

void spvc_hlsl_resource_binding_init(spvc_hlsl_resource_binding *binding)

{
  (binding->uav).register_space = 0;
  (binding->uav).register_binding = 0;
  (binding->srv).register_space = 0;
  (binding->srv).register_binding = 0;
  binding->desc_set = 0;
  binding->binding = 0;
  (binding->cbv).register_space = 0;
  (binding->cbv).register_binding = 0;
  (binding->sampler).register_space = 0;
  (binding->sampler).register_binding = 0;
  binding->stage = SpvExecutionModelMax;
  return;
}

Assistant:

void spvc_hlsl_resource_binding_init(spvc_hlsl_resource_binding *binding)
{
#if SPIRV_CROSS_C_API_HLSL
	HLSLResourceBinding binding_default;
	binding->desc_set = binding_default.desc_set;
	binding->binding = binding_default.binding;
	binding->cbv.register_binding = binding_default.cbv.register_binding;
	binding->cbv.register_space = binding_default.cbv.register_space;
	binding->srv.register_binding = binding_default.srv.register_binding;
	binding->srv.register_space = binding_default.srv.register_space;
	binding->uav.register_binding = binding_default.uav.register_binding;
	binding->uav.register_space = binding_default.uav.register_space;
	binding->sampler.register_binding = binding_default.sampler.register_binding;
	binding->sampler.register_space = binding_default.sampler.register_space;
	binding->stage = static_cast<SpvExecutionModel>(binding_default.stage);
#else
	memset(binding, 0, sizeof(*binding));
#endif
}